

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_read_cod_v2(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                        opj_event_mgr *p_manager)

{
  long lVar1;
  int iVar2;
  OPJ_BYTE *pOVar3;
  opj_event_mgr_t *in_RCX;
  uint in_EDX;
  OPJ_BYTE *in_RSI;
  long in_RDI;
  opj_image_t *l_image;
  opj_tcp_v2_t *l_tcp;
  opj_cp_v2_t *l_cp;
  OPJ_UINT32 l_tmp;
  OPJ_UINT32 i;
  OPJ_UINT32 *local_50;
  OPJ_UINT32 local_30;
  uint local_2c;
  uint in_stack_ffffffffffffffe0;
  long lVar4;
  OPJ_UINT32 compno;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  opj_bool oVar5;
  
  lVar1 = *(long *)(in_RDI + 0x60);
  if (*(int *)(in_RDI + 8) == 0x10) {
    local_50 = (OPJ_UINT32 *)(*(long *)(in_RDI + 0xd0) + (ulong)*(uint *)(in_RDI + 0x118) * 0x1630);
  }
  else {
    local_50 = *(OPJ_UINT32 **)(in_RDI + 0x10);
  }
  if (in_EDX < 5) {
    opj_event_msg_v2(in_RCX,1,"Error reading COD marker\n");
    oVar5 = 0;
  }
  else {
    lVar4 = in_RDI;
    opj_read_bytes_LE(in_RSI,local_50,1);
    compno = (OPJ_UINT32)((ulong)lVar4 >> 0x20);
    pOVar3 = in_RSI + 1;
    opj_read_bytes_LE(pOVar3,&local_30,1);
    pOVar3 = pOVar3 + 1;
    local_50[1] = local_30;
    opj_read_bytes_LE(pOVar3,local_50 + 2,2);
    pOVar3 = pOVar3 + 2;
    if (*(int *)(in_RDI + 0xdc) == 0) {
      local_50[3] = local_50[2];
    }
    else {
      local_50[3] = *(OPJ_UINT32 *)(in_RDI + 0xdc);
    }
    opj_read_bytes_LE(pOVar3,local_50 + 4,1);
    iVar2 = in_EDX - 5;
    for (local_2c = 0; local_2c < *(uint *)(lVar1 + 0x10); local_2c = local_2c + 1) {
      *(OPJ_UINT32 *)(*(long *)(local_50 + 0x574) + (ulong)local_2c * 0x438) = *local_50 & 1;
    }
    oVar5 = j2k_read_SPCod_SPCoc
                      ((opj_j2k_v2_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                       ,compno,pOVar3 + 1,(OPJ_UINT32 *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                       in_RCX);
    if (oVar5 == 0) {
      opj_event_msg_v2(in_RCX,1,"Error reading COD marker\n");
      oVar5 = 0;
    }
    else if (iVar2 == 0) {
      j2k_copy_tile_component_parameters((opj_j2k_v2_t *)(ulong)in_stack_ffffffffffffffe0);
      oVar5 = 1;
    }
    else {
      opj_event_msg_v2(in_RCX,1,"Error reading COD marker\n");
      oVar5 = 0;
    }
  }
  return oVar5;
}

Assistant:

opj_bool j2k_read_cod_v2 (
					opj_j2k_v2_t *p_j2k,
					OPJ_BYTE * p_header_data,
					OPJ_UINT32 p_header_size,
					struct opj_event_mgr * p_manager
					)
{
	/* loop */
	OPJ_UINT32 i;
	OPJ_UINT32 l_tmp;
	opj_cp_v2_t *l_cp = 00;
	opj_tcp_v2_t *l_tcp = 00;
	opj_image_t *l_image = 00;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	l_image = p_j2k->m_private_image;
	l_cp = &(p_j2k->m_cp);

	/* If we are in the first tile-part header of the current tile */
	l_tcp = (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH) ?
				&l_cp->tcps[p_j2k->m_current_tile_number] :
				p_j2k->m_specific_param.m_decoder.m_default_tcp;

	/* Make sure room is sufficient */
	if (p_header_size < 5) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading COD marker\n");
		return OPJ_FALSE;
	}

	opj_read_bytes(p_header_data,&l_tcp->csty,1);		/* Scod */
	++p_header_data;
	opj_read_bytes(p_header_data,&l_tmp,1);				/* SGcod (A) */
	++p_header_data;
	l_tcp->prg = (OPJ_PROG_ORDER) l_tmp;
	opj_read_bytes(p_header_data,&l_tcp->numlayers,2);	/* SGcod (B) */
	p_header_data+=2;

	/* If user didn't set a number layer to decode take the max specify in the codestream. */
	if	(l_cp->m_specific_param.m_dec.m_layer) {
		l_tcp->num_layers_to_decode = l_cp->m_specific_param.m_dec.m_layer;
	}
	else {
		l_tcp->num_layers_to_decode = l_tcp->numlayers;
	}

	opj_read_bytes(p_header_data,&l_tcp->mct,1);		/* SGcod (C) */
	++p_header_data;

	p_header_size -= 5;
	for	(i = 0; i < l_image->numcomps; ++i) {
		l_tcp->tccps[i].csty = l_tcp->csty & J2K_CCP_CSTY_PRT;
	}

	if (! j2k_read_SPCod_SPCoc(p_j2k,0,p_header_data,&p_header_size,p_manager)) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading COD marker\n");
		return OPJ_FALSE;
	}

	if (p_header_size != 0) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading COD marker\n");
		return OPJ_FALSE;
	}

	/* Apply the coding style to other components of the current tile or the m_default_tcp*/
	j2k_copy_tile_component_parameters(p_j2k);

	/* Index */
#ifdef WIP_REMOVE_MSD
	if (p_j2k->cstr_info) {
		/*opj_codestream_info_t *l_cstr_info = p_j2k->cstr_info;*/
		p_j2k->cstr_info->prog = l_tcp->prg;
		p_j2k->cstr_info->numlayers = l_tcp->numlayers;
		p_j2k->cstr_info->numdecompos = (OPJ_INT32*) opj_malloc(l_image->numcomps * sizeof(OPJ_UINT32));
		for	(i = 0; i < l_image->numcomps; ++i) {
			p_j2k->cstr_info->numdecompos[i] = l_tcp->tccps[i].numresolutions - 1;
		}
	}
#endif

	return OPJ_TRUE;
}